

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

optional<bool> __thiscall ArgsManager::GetBoolArg(ArgsManager *this,string *strArg)

{
  _Optional_base<bool,_true,_true> _Var1;
  long in_FS_OFFSET;
  SettingsValue value;
  SettingsValue SStack_68;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(&SStack_68,this,strArg);
  _Var1._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload<bool,_true,_true,_true>)SettingToBool(&SStack_68);
  UniValue::~UniValue(&SStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (_Optional_base<bool,_true,_true>)
           (_Optional_base<bool,_true,_true>)_Var1._M_payload.super__Optional_payload_base<bool>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<bool> ArgsManager::GetBoolArg(const std::string& strArg) const
{
    const common::SettingsValue value = GetSetting(strArg);
    return SettingToBool(value);
}